

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O0

int XPMPChangePlaneModel(XPMPPlaneID _id,char *inICAO,char *inAirline,char *inLivery)

{
  Aircraft *_icaoType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Aircraft *pAc;
  undefined8 in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  string *_livery;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  Aircraft *in_stack_ffffffffffffff50;
  string local_a8 [39];
  allocator<char> local_81;
  string local_80 [55];
  undefined1 local_49 [33];
  Aircraft *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  int local_4;
  
  local_10 = in_RSI;
  _icaoType = XPMP2::AcFindByID((XPMPPlaneID)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  if (_icaoType == (Aircraft *)0x0) {
    local_4 = -1;
  }
  else {
    __a = local_10;
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      __a = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x38af55;
    }
    _livery = (string *)local_49;
    this = __a;
    local_28 = _icaoType;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)_livery,(allocator<char> *)__a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)_livery,(allocator<char> *)__a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)_livery,(allocator<char> *)__a);
    local_4 = XPMP2::Aircraft::ChangeModel
                        (in_stack_ffffffffffffff50,(string *)_icaoType,this,_livery);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
    std::__cxx11::string::~string((string *)(local_49 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_49);
  }
  return local_4;
}

Assistant:

int     XPMPChangePlaneModel(XPMPPlaneID            _id,
                             const char *           inICAO,
                             const char *           inAirline,
                             const char *           inLivery)
{
    Aircraft* pAc = AcFindByID(_id);
    if (pAc)
        return pAc->ChangeModel(inICAO      ? inICAO : "",
                                inAirline   ? inAirline : "",
                                inLivery    ? inLivery : "");
    else
        return -1;
}